

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

environment<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *
nonius::detail::measure_environment<std::chrono::_V2::system_clock>(reporter *rep)

{
  environment_estimate<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> estimate;
  environment_estimate<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> estimate_00;
  environment<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *in_RDI;
  int in_stack_00000054;
  environment_estimate<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> cost;
  environment_estimate<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> resolution;
  int iters;
  undefined8 in_stack_ffffffffffffff28;
  int iterations;
  reporter *in_stack_ffffffffffffff30;
  environment<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *this;
  environment_estimate<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  rep rVar1;
  rep local_70;
  undefined8 local_68;
  undefined8 local_60;
  int local_58;
  rep local_30;
  undefined8 local_28;
  undefined8 local_20;
  int local_18;
  
  iterations = (int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  this = in_RDI;
  reporter::warmup_start((reporter *)0x218076);
  warmup<std::chrono::_V2::system_clock>();
  reporter::warmup_end(in_stack_ffffffffffffff30,iterations);
  reporter::estimate_clock_resolution_start((reporter *)0x2180a3);
  estimate_clock_resolution<std::chrono::_V2::system_clock>(in_stack_00000054);
  environment_estimate::operator_cast_to_environment_estimate(in_stack_ffffffffffffff70);
  estimate.outliers.samples_seen = (int)in_stack_ffffffffffffff78;
  estimate.outliers.low_severe = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  estimate.mean.__r = (rep)in_stack_ffffffffffffff70;
  estimate.outliers.low_mild = (int)in_stack_ffffffffffffff80;
  estimate.outliers.high_mild = (int)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  estimate._24_8_ = in_stack_ffffffffffffff88;
  reporter::estimate_clock_resolution_complete((reporter *)this,estimate);
  reporter::estimate_clock_cost_start((reporter *)0x21811a);
  rVar1 = local_30;
  estimate_clock_cost<std::chrono::_V2::system_clock>
            ((FloatDuration<std::chrono::_V2::system_clock>)resolution._24_8_);
  environment_estimate::operator_cast_to_environment_estimate(in_stack_ffffffffffffff70);
  estimate_00.outliers.samples_seen = (int)in_stack_ffffffffffffff78;
  estimate_00.outliers.low_severe = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  estimate_00.mean.__r = (rep)in_stack_ffffffffffffff70;
  estimate_00.outliers.low_mild = (int)in_stack_ffffffffffffff80;
  estimate_00.outliers.high_mild = (int)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  estimate_00._24_8_ = rVar1;
  reporter::estimate_clock_cost_complete((reporter *)this,estimate_00);
  (in_RDI->clock_resolution).mean.__r = local_30;
  (in_RDI->clock_resolution).outliers.samples_seen = (undefined4)local_28;
  (in_RDI->clock_resolution).outliers.low_severe = local_28._4_4_;
  (in_RDI->clock_resolution).outliers.low_mild = (undefined4)local_20;
  (in_RDI->clock_resolution).outliers.high_mild = local_20._4_4_;
  (in_RDI->clock_resolution).outliers.high_severe = local_18;
  (in_RDI->clock_cost).mean.__r = local_70;
  (in_RDI->clock_cost).outliers.samples_seen = (undefined4)local_68;
  (in_RDI->clock_cost).outliers.low_severe = local_68._4_4_;
  (in_RDI->clock_cost).outliers.low_mild = (undefined4)local_60;
  (in_RDI->clock_cost).outliers.high_mild = local_60._4_4_;
  (in_RDI->clock_cost).outliers.high_severe = local_58;
  return this;
}

Assistant:

environment<FloatDuration<Clock>> measure_environment(reporter& rep) {
            rep.warmup_start();
            auto iters = detail::warmup<Clock>();
            rep.warmup_end(iters);

            rep.estimate_clock_resolution_start();
            auto resolution = detail::estimate_clock_resolution<Clock>(iters);
            rep.estimate_clock_resolution_complete(resolution);

            rep.estimate_clock_cost_start();
            auto cost = detail::estimate_clock_cost<Clock>(resolution.mean);
            rep.estimate_clock_cost_complete(cost);

            return { resolution, cost };
        }